

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureQueryCase::createInstance(TextureQueryCase *this,Context *context)

{
  deInt32 *pdVar1;
  int *piVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImageBackingMode IVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  _func_int **pp_Var11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  iterator __position;
  TestLog *pTVar16;
  TextureSpec *pTVar17;
  undefined1 auVar18 [16];
  VkFormat format;
  uint uVar19;
  int iVar20;
  TextureChannelClass TVar21;
  uint uVar22;
  TextureQueryInstance *pTVar23;
  TextureFormat TVar24;
  InstanceInterface *pIVar25;
  VkPhysicalDevice pVVar26;
  SharedPtrStateBase *pSVar27;
  ulong uVar28;
  VkPhysicalDeviceProperties *pVVar29;
  NotSupportedError *this_00;
  IVec3 *pIVar30;
  uint uVar31;
  long lVar32;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar33 [16];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  CubeFaceFloatCoords CVar43;
  CubeFaceFloatCoords CVar44;
  CubeFaceFloatCoords CVar45;
  TextureBindingSp textureBinding;
  float p;
  undefined8 in_stack_fffffffffffffdb8;
  float local_22c;
  value_type local_228;
  IVec3 local_218;
  undefined1 local_208 [16];
  string local_1f0;
  float local_1d0;
  float local_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b0 [4];
  float fStack_1ac;
  float local_1a8 [3];
  VkSampleCountFlagBits local_19c;
  ios_base local_138 [264];
  
  uVar22 = (uint)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  switch(this->m_function) {
  case QUERYFUNCTION_TEXTURESIZE:
    pTVar23 = (TextureQueryInstance *)operator_new(0x248);
    TextureQueryInstance::TextureQueryInstance
              (pTVar23,context,(this->super_ShaderRenderCase).m_isVertexCase,&this->m_textureSpec);
    (pTVar23->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__ShaderRenderCaseInstance_00d2d3c8;
    pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance =
         (_func_int **)0x0;
    pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = (Context *)0x0;
    pTVar23[1].super_ShaderRenderCaseInstance.m_imageBackingMode = IMAGE_BACKING_MODE_REGULAR;
    pTVar23[1].super_ShaderRenderCaseInstance.m_quadGridSize = 0;
    pTVar23[1].super_ShaderRenderCaseInstance.m_sparseContext.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
    .m_data.ptr = (SparseContext *)0x0;
    *(undefined1 (*) [16])
     &pTVar23[1].super_ShaderRenderCaseInstance.m_sparseContext.
      super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
      .m_data.field_0x8 = (undefined1  [16])0x0;
    break;
  case QUERYFUNCTION_TEXTUREQUERYLOD:
    pTVar23 = (TextureQueryInstance *)operator_new(0x248);
    TextureQueryInstance::TextureQueryInstance
              (pTVar23,context,(this->super_ShaderRenderCase).m_isVertexCase,&this->m_textureSpec);
    (pTVar23->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__ShaderRenderCaseInstance_00d2d488;
    pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance =
         (_func_int **)0x0;
    pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = (Context *)0x0;
    pTVar23[1].super_ShaderRenderCaseInstance.m_imageBackingMode = IMAGE_BACKING_MODE_REGULAR;
    pTVar23[1].super_ShaderRenderCaseInstance.m_quadGridSize = 0;
    pTVar23[1].super_ShaderRenderCaseInstance.m_sparseContext.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
    .m_data.ptr = (SparseContext *)0x0;
    *(undefined1 (*) [16])
     &pTVar23[1].super_ShaderRenderCaseInstance.m_sparseContext.
      super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
      .m_data.field_0x8 = (undefined1  [16])0x0;
    pTVar16 = ((pTVar23->super_ShaderRenderCaseInstance).super_TestInstance.m_context)->m_testCtx->
              m_log;
    local_218.m_data[2] = pTVar23->m_textureSpec->depth;
    pIVar30 = *(IVec3 **)&pTVar23->m_textureSpec->width;
    local_228.m_ptr = (TextureBinding *)0x0;
    local_228.m_state = (SharedPtrStateBase *)0x0;
    local_1b0 = SUB84(pTVar16,0);
    fStack_1ac = (float)((ulong)pTVar16 >> 0x20);
    local_218.m_data._0_8_ = pIVar30;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Image size: ",0xc);
    sr::(anonymous_namespace)::getTextureSizeString_abi_cxx11_
              (&local_1f0,(_anonymous_namespace_ *)(ulong)pTVar23->m_textureSpec->type,
               (TextureType)&local_218,pIVar30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               (char *)CONCAT44(local_1f0._M_dataplus._M_p._4_4_,(uint)local_1f0._M_dataplus._M_p),
               local_1f0._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1f0._M_dataplus._M_p._4_4_,(uint)local_1f0._M_dataplus._M_p) !=
        &local_1f0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1f0._M_dataplus._M_p._4_4_,(uint)local_1f0._M_dataplus._M_p),
                      local_1f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pTVar17 = pTVar23->m_textureSpec;
    createEmptyTexture((anon_unknown_0 *)local_1b0,pTVar17->format,pTVar17->type,&local_218,
                       pTVar17->numLevels,0,&pTVar17->sampler);
    pSVar27 = (SharedPtrStateBase *)CONCAT44(local_1a8[1],local_1a8[0]);
    if (local_228.m_state == pSVar27) {
LAB_00638748:
      if (pSVar27 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &pSVar27->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_1b0 = (undefined1  [4])0x0;
          fStack_1ac = 0.0;
          (**(code **)(*(long *)CONCAT44(local_1a8[1],local_1a8[0]) + 0x10))();
        }
        LOCK();
        piVar2 = (int *)(CONCAT44(local_1a8[1],local_1a8[0]) + 0xc);
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) && ((long *)CONCAT44(local_1a8[1],local_1a8[0]) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_1a8[1],local_1a8[0]) + 8))();
        }
      }
    }
    else {
      if (local_228.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_228.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_228.m_ptr = (TextureBinding *)0x0;
          (*(local_228.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_228.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) && (local_228.m_state != (SharedPtrStateBase *)0x0)) {
          (*(local_228.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        pSVar27 = (SharedPtrStateBase *)CONCAT44(local_1a8[1],local_1a8[0]);
      }
      local_228.m_ptr = (TextureBinding *)CONCAT44(fStack_1ac,local_1b0);
      local_228.m_state = pSVar27;
      if (pSVar27 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSVar27->strongRefCount = pSVar27->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pSVar27->weakRefCount = pSVar27->weakRefCount + 1;
        UNLOCK();
        pSVar27 = (SharedPtrStateBase *)CONCAT44(local_1a8[1],local_1a8[0]);
        goto LAB_00638748;
      }
    }
    std::
    vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
    ::push_back(&(pTVar23->super_ShaderRenderCaseInstance).m_textures,&local_228);
    if (local_228.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_228.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_228.m_ptr = (TextureBinding *)0x0;
        (*(local_228.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_228.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_228.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_228.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    uVar28 = (ulong)pTVar23->m_textureSpec->type;
    if (uVar28 < 7) {
      uVar3 = *(undefined4 *)(&DAT_00b26ad8 + uVar28 * 4);
      uVar4 = *(undefined4 *)(&DAT_00b26af4 + uVar28 * 4);
      IVar5 = *(ImageBackingMode *)(&DAT_00b26b10 + uVar28 * 4);
      dVar6 = *(deUint32 *)(&DAT_00b26b2c + uVar28 * 4);
      uVar7 = *(undefined4 *)(&DAT_00b26b48 + uVar28 * 4);
      *(undefined4 *)
       &pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance =
           *(undefined4 *)(&DAT_00b26abc + uVar28 * 4);
      *(undefined4 *)
       ((long)&pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance + 4)
           = uVar3;
      *(undefined4 *)&pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = uVar4
      ;
      *(undefined4 *)
       ((long)&pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context + 4) = 0;
      pTVar23[1].super_ShaderRenderCaseInstance.m_imageBackingMode = IVar5;
      pTVar23[1].super_ShaderRenderCaseInstance.m_quadGridSize = dVar6;
      *(undefined4 *)
       &pTVar23[1].super_ShaderRenderCaseInstance.m_sparseContext.
        super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
        .m_data.ptr = uVar7;
      *(undefined4 *)
       ((long)&pTVar23[1].super_ShaderRenderCaseInstance.m_sparseContext.
               super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
               .m_data.ptr + 4) = 0;
    }
    ShaderRenderCaseInstance::getViewportSize((ShaderRenderCaseInstance *)pTVar23);
    pVVar29 = Context::getDeviceProperties
                        ((pTVar23->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
    pTVar17 = pTVar23->m_textureSpec;
    if (TEXTURETYPE_CUBE_ARRAY < pTVar17->type) {
      local_22c = *(float *)&pTVar23[1].super_ShaderRenderCaseInstance.m_sparseContext.
                             super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                             .m_data.field_0xc;
      goto LAB_00638b79;
    }
    fVar42 = (float)((pVVar29->limits).mipmapPrecisionBits * -0x800000 + 0x3f800000) + 0.008;
    switch(pTVar17->type) {
    default:
      fVar41 = ((float)pTVar17->width *
               ((float)pTVar23[1].super_ShaderRenderCaseInstance.m_imageBackingMode -
               *(float *)&pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance.
                          _vptr_TestInstance)) / (float)(uint)local_1f0._M_dataplus._M_p;
      uVar22 = -(uint)(-fVar41 <= fVar41);
      fVar41 = (float)(~uVar22 & (uint)-fVar41 | (uint)fVar41 & uVar22);
      fVar41 = (float)(-(uint)(0.0 <= fVar41) & (uint)fVar41);
      local_208 = ZEXT416((uint)fVar41);
      fVar41 = logf(fVar41);
      *(float *)&pTVar23[1].super_ShaderRenderCaseInstance.m_sparseContext.
                 super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                 .m_data.field_0x8 = fVar41 * 1.442695 - fVar42;
      fVar41 = (float)local_208._0_4_;
      goto LAB_00638b58;
    case TEXTURETYPE_2D:
    case TEXTURETYPE_2D_ARRAY:
      pp_Var11 = pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance;
      uVar9 = pTVar23[1].super_ShaderRenderCaseInstance.m_imageBackingMode;
      uVar14 = pTVar23[1].super_ShaderRenderCaseInstance.m_quadGridSize;
      auVar39._4_4_ = 0;
      auVar39._0_4_ = (uint)local_1f0._M_dataplus._M_p;
      auVar39._8_4_ = local_1f0._M_dataplus._M_p._4_4_;
      auVar39._12_4_ = 0;
      uVar10 = pTVar17->width;
      uVar15 = pTVar17->height;
      auVar40._0_4_ = (float)(SUB168(auVar39 | _DAT_00ac4a10,0) - (double)DAT_00ac4a10);
      auVar40._4_4_ = (float)(SUB168(auVar39 | _DAT_00ac4a10,8) - DAT_00ac4a10._8_8_);
      auVar40._8_8_ = 0;
      auVar33._0_4_ = (float)(int)uVar10 * ((float)uVar9 - SUB84(pp_Var11,0));
      auVar33._4_4_ = (float)(int)uVar15 * ((float)uVar14 - (float)((ulong)pp_Var11 >> 0x20));
      auVar33._8_8_ = 0;
      auVar36 = divps(auVar33,auVar40);
      fVar41 = auVar36._0_4_;
      fVar34 = auVar36._4_4_;
      auVar18._4_4_ = -(uint)(0.0 <= fVar41);
      auVar18._0_4_ = -(uint)(0.0 <= fVar41);
      auVar18._8_4_ = -(uint)(0.0 <= fVar34);
      auVar18._12_4_ = -(uint)(0.0 <= fVar34);
      uVar22 = movmskpd(0xb26730,auVar18);
      if ((uVar22 & 1) == 0) {
        fVar41 = -fVar41;
      }
      fVar41 = (float)(-(uint)(0.0 <= fVar41) & (uint)fVar41);
      if ((uVar22 & 2) == 0) {
        fVar34 = -fVar34;
      }
      fVar34 = (float)(~-(uint)(fVar34 <= 0.0) & (uint)fVar34);
      break;
    case TEXTURETYPE_3D:
      fVar41 = ((float)pTVar17->width *
               ((float)pTVar23[1].super_ShaderRenderCaseInstance.m_imageBackingMode -
               *(float *)&pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance.
                          _vptr_TestInstance)) / (float)(uint)local_1f0._M_dataplus._M_p;
      local_1c8._0_4_ = fVar41;
      local_1cc = ((float)pTVar17->height *
                  ((float)pTVar23[1].super_ShaderRenderCaseInstance.m_quadGridSize -
                  *(float *)((long)&pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance.
                                    _vptr_TestInstance + 4))) /
                  (float)local_1f0._M_dataplus._M_p._4_4_;
      local_1d0 = (float)pTVar17->depth *
                  (*(float *)&pTVar23[1].super_ShaderRenderCaseInstance.m_sparseContext.
                              super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                              .m_data.ptr -
                  *(float *)&pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context)
                  * 0.5;
      fVar34 = local_1d0 / (float)(uint)local_1f0._M_dataplus._M_p;
      local_208._0_4_ = fVar34;
      local_1d0 = local_1d0 / (float)local_1f0._M_dataplus._M_p._4_4_;
      fVar41 = TextureTestUtil::computeLodFromDerivates
                         (LODMODE_MIN_BOUND,fVar41,0.0,fVar34,0.0,local_1cc,local_1d0);
      *(float *)&pTVar23[1].super_ShaderRenderCaseInstance.m_sparseContext.
                 super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                 .m_data.field_0x8 = fVar41 - fVar42;
      local_22c = TextureTestUtil::computeLodFromDerivates
                            (LODMODE_MAX_BOUND,(float)local_1c8._0_4_,0.0,(float)local_208._0_4_,0.0
                             ,local_1cc,local_1d0);
      goto LAB_00638b65;
    case TEXTURETYPE_CUBE_MAP:
    case TEXTURETYPE_CUBE_ARRAY:
      local_1a8[0] = *(float *)&pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance.
                                m_context;
      pp_Var11 = pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance;
      local_1b0 = SUB84(pp_Var11,0);
      fStack_1ac = (float)((ulong)pp_Var11 >> 0x20);
      CVar43 = tcu::getCubeFaceCoords((Vec3 *)local_1b0);
      local_208._4_4_ = extraout_XMM0_Db;
      local_208._0_4_ = CVar43.t;
      local_208._8_4_ = extraout_XMM0_Dc;
      local_208._12_4_ = extraout_XMM0_Dd;
      local_1b0 = (undefined1  [4])pTVar23[1].super_ShaderRenderCaseInstance.m_imageBackingMode;
      uVar12 = *(undefined8 *)
                ((long)&pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance.
                        _vptr_TestInstance + 4);
      fStack_1ac = (float)uVar12;
      local_1a8[0] = (float)((ulong)uVar12 >> 0x20);
      CVar44 = tcu::getCubeFaceCoords((Vec3 *)local_1b0);
      fStack_1ac = (float)pTVar23[1].super_ShaderRenderCaseInstance.m_quadGridSize;
      local_1b0 = *(undefined1 (*) [4])
                   &pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance;
      local_1a8[0] = *(float *)&pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance.
                                m_context;
      CVar45 = tcu::getCubeFaceCoords((Vec3 *)local_1b0);
      pTVar17 = pTVar23->m_textureSpec;
      auVar37._4_4_ = 0;
      auVar37._0_4_ = (uint)local_1f0._M_dataplus._M_p;
      auVar37._8_4_ = local_1f0._M_dataplus._M_p._4_4_;
      auVar37._12_4_ = 0;
      uVar8 = pTVar17->width;
      uVar13 = pTVar17->height;
      auVar38._0_4_ = (float)(SUB168(auVar37 | _DAT_00ac4a10,0) - (double)DAT_00ac4a10);
      auVar38._4_4_ = (float)(SUB168(auVar37 | _DAT_00ac4a10,8) - DAT_00ac4a10._8_8_);
      auVar38._8_8_ = 0;
      auVar35._0_4_ = (float)(int)uVar8 * (CVar44.s - CVar43.s);
      auVar35._4_4_ = (float)(int)uVar13 * (CVar45.t - (float)local_208._0_4_);
      auVar35._8_8_ = 0;
      auVar36 = divps(auVar35,auVar38);
      fVar41 = auVar36._0_4_;
      fVar34 = auVar36._4_4_;
      auVar36._4_4_ = -(uint)(0.0 <= fVar41);
      auVar36._0_4_ = -(uint)(0.0 <= fVar41);
      auVar36._8_4_ = -(uint)(0.0 <= fVar34);
      auVar36._12_4_ = -(uint)(0.0 <= fVar34);
      uVar22 = movmskpd((int)pTVar17,auVar36);
      if ((uVar22 & 1) == 0) {
        fVar41 = -fVar41;
      }
      fVar41 = (float)(-(uint)(0.0 <= fVar41) & (uint)fVar41);
      if ((uVar22 & 2) == 0) {
        fVar34 = -fVar34;
      }
      fVar34 = (float)(~-(uint)(fVar34 <= 0.0) & (uint)fVar34);
    }
    local_208 = ZEXT416((uint)fVar34);
    local_1c8 = ZEXT416((uint)fVar41);
    fVar41 = logf((float)(~-(uint)(fVar34 <= fVar41) & (uint)fVar34 |
                         -(uint)(fVar34 <= fVar41) & (uint)fVar41));
    *(float *)&pTVar23[1].super_ShaderRenderCaseInstance.m_sparseContext.
               super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
               .m_data.field_0x8 = fVar41 * 1.442695 - fVar42;
    fVar41 = (float)local_208._0_4_ + (float)local_1c8._0_4_;
LAB_00638b58:
    local_22c = logf(fVar41);
    local_22c = local_22c * 1.442695;
LAB_00638b65:
    local_22c = local_22c + fVar42;
    *(float *)&pTVar23[1].super_ShaderRenderCaseInstance.m_sparseContext.
               super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
               .m_data.field_0xc = local_22c;
LAB_00638b79:
    uVar22 = pTVar23->m_textureSpec->numLevels;
    fVar42 = TextureQueryLodInstance::computeLevelFromLod
                       ((TextureQueryLodInstance *)(ulong)uVar22,
                        *(float *)&pTVar23[1].super_ShaderRenderCaseInstance.m_sparseContext.
                                   super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                                   .m_data.field_0x8);
    *(float *)&pTVar23[1].super_ShaderRenderCaseInstance.m_memAlloc = fVar42;
    fVar42 = TextureQueryLodInstance::computeLevelFromLod
                       ((TextureQueryLodInstance *)(ulong)uVar22,local_22c);
    *(float *)((long)&pTVar23[1].super_ShaderRenderCaseInstance.m_memAlloc + 4) = fVar42;
    return (TestInstance *)pTVar23;
  case QUERYFUNCTION_TEXTUREQUERYLEVELS:
    pTVar23 = (TextureQueryInstance *)operator_new(0x230);
    TextureQueryInstance::TextureQueryInstance
              (pTVar23,context,(this->super_ShaderRenderCase).m_isVertexCase,&this->m_textureSpec);
    (pTVar23->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__ShaderRenderCaseInstance_00d2d4e8;
    pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance =
         (_func_int **)0x0;
    pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = (Context *)0x0;
    pTVar23[1].super_ShaderRenderCaseInstance.m_imageBackingMode = IMAGE_BACKING_MODE_REGULAR;
    pTVar23[1].super_ShaderRenderCaseInstance.m_quadGridSize = 0;
    break;
  case QUERYFUNCTION_TEXTURESAMPLES:
    pTVar23 = (TextureQueryInstance *)operator_new(0x238);
    TextureQueryInstance::TextureQueryInstance
              (pTVar23,context,(this->super_ShaderRenderCase).m_isVertexCase,&this->m_textureSpec);
    (pTVar23->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__TextureSamplesInstance_00d2d548;
    *(undefined4 *)&pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance
         = 0;
    *(undefined1 (*) [16])&pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context =
         (undefined1  [16])0x0;
    pTVar23[1].super_ShaderRenderCaseInstance.m_sparseContext.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
    .m_data.ptr = (SparseContext *)0x0;
    *(undefined8 *)(pTVar23->super_ShaderRenderCaseInstance).m_renderSize.m_data = 0x100000001;
    TVar24 = glu::mapGLInternalFormat(pTVar23->m_textureSpec->format);
    local_1b0 = (undefined1  [4])TVar24.order;
    fStack_1ac = (float)TVar24.type;
    format = ::vk::mapTextureFormat((TextureFormat *)local_1b0);
    uVar19 = pTVar23->m_textureSpec->type - TEXTURETYPE_2D;
    uVar31 = 0;
    if (uVar19 < 6) {
      uVar31 = *(uint *)(&DAT_00b26b64 + (ulong)uVar19 * 4);
    }
    pIVar25 = Context::getInstanceInterface
                        ((pTVar23->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
    pVVar26 = Context::getPhysicalDevice
                        ((pTVar23->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
    iVar20 = (*pIVar25->_vptr_InstanceInterface[4])
                       (pIVar25,pVVar26,(ulong)format,(ulong)uVar31,0,6,(ulong)uVar22 << 0x20,
                        (TextureFormat *)local_1b0);
    if (iVar20 == -0xb) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Format not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderTextureFunctionTests.cpp"
                 ,0x7ca);
      goto LAB_00638d2c;
    }
    lVar32 = 0;
    do {
      if ((local_19c &
          *(VkSampleCountFlagBits *)
           ((long)&sr::(anonymous_namespace)::TextureSamplesInstance::
                   TextureSamplesInstance(vkt::Context&,bool,vkt::sr::(anonymous_namespace)::TextureSpec_const&)
                   ::sampleFlags + lVar32)) != 0) {
        __position._M_current =
             *(VkSampleCountFlagBits **)
              &pTVar23[1].super_ShaderRenderCaseInstance.m_imageBackingMode;
        if ((SparseContext *)__position._M_current ==
            pTVar23[1].super_ShaderRenderCaseInstance.m_sparseContext.
            super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
            .m_data.ptr) {
          std::vector<vk::VkSampleCountFlagBits,std::allocator<vk::VkSampleCountFlagBits>>::
          _M_realloc_insert<vk::VkSampleCountFlagBits_const&>
                    ((vector<vk::VkSampleCountFlagBits,std::allocator<vk::VkSampleCountFlagBits>> *)
                     &pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context,
                     __position,
                     (VkSampleCountFlagBits *)
                     ((long)&sr::(anonymous_namespace)::TextureSamplesInstance::
                             TextureSamplesInstance(vkt::Context&,bool,vkt::sr::(anonymous_namespace)::TextureSpec_const&)
                             ::sampleFlags + lVar32));
        }
        else {
          *__position._M_current =
               *(VkSampleCountFlagBits *)
                ((long)&sr::(anonymous_namespace)::TextureSamplesInstance::
                        TextureSamplesInstance(vkt::Context&,bool,vkt::sr::(anonymous_namespace)::TextureSpec_const&)
                        ::sampleFlags + lVar32);
          *(VkSampleCountFlagBits **)&pTVar23[1].super_ShaderRenderCaseInstance.m_imageBackingMode =
               __position._M_current + 1;
        }
      }
      lVar32 = lVar32 + 4;
    } while (lVar32 != 0x18);
    if (pTVar23[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context ==
        *(Context **)&pTVar23[1].super_ShaderRenderCaseInstance.m_imageBackingMode) {
      TVar24 = ::vk::mapVkFormat(format);
      TVar21 = tcu::getTextureChannelClass(TVar24.type);
      if (TVar21 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
        TVar24 = ::vk::mapVkFormat(format);
        TVar21 = tcu::getTextureChannelClass(TVar24.type);
        if (TVar21 != TEXTURECHANNELCLASS_SIGNED_INTEGER) goto LAB_00638368;
      }
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,
                 "Skipping validation of integer formats as only VK_SAMPLE_COUNT_1_BIT is supported."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderTextureFunctionTests.cpp"
                 ,0x7f2);
LAB_00638d2c:
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
LAB_00638368:
    pTVar16 = ((pTVar23->super_ShaderRenderCaseInstance).super_TestInstance.m_context)->m_testCtx->
              m_log;
    local_218.m_data[2] = pTVar23->m_textureSpec->depth;
    pIVar30 = *(IVec3 **)&pTVar23->m_textureSpec->width;
    local_228.m_ptr = (TextureBinding *)0x0;
    local_228.m_state = (SharedPtrStateBase *)0x0;
    local_1b0 = SUB84(pTVar16,0);
    fStack_1ac = (float)((ulong)pTVar16 >> 0x20);
    local_218.m_data._0_8_ = pIVar30;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Image size: ",0xc);
    sr::(anonymous_namespace)::getTextureSizeString_abi_cxx11_
              (&local_1f0,(_anonymous_namespace_ *)(ulong)pTVar23->m_textureSpec->type,
               (TextureType)&local_218,pIVar30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               (char *)CONCAT44(local_1f0._M_dataplus._M_p._4_4_,(uint)local_1f0._M_dataplus._M_p),
               local_1f0._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1f0._M_dataplus._M_p._4_4_,(uint)local_1f0._M_dataplus._M_p) !=
        &local_1f0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1f0._M_dataplus._M_p._4_4_,(uint)local_1f0._M_dataplus._M_p),
                      local_1f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pTVar17 = pTVar23->m_textureSpec;
    createEmptyTexture((anon_unknown_0 *)local_1b0,pTVar17->format,pTVar17->type,&local_218,
                       pTVar17->numLevels,0,&pTVar17->sampler);
    pSVar27 = (SharedPtrStateBase *)CONCAT44(local_1a8[1],local_1a8[0]);
    if (local_228.m_state != pSVar27) {
      if (local_228.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_228.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_228.m_ptr = (TextureBinding *)0x0;
          (*(local_228.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_228.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) && (local_228.m_state != (SharedPtrStateBase *)0x0)) {
          (*(local_228.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        pSVar27 = (SharedPtrStateBase *)CONCAT44(local_1a8[1],local_1a8[0]);
      }
      local_228.m_ptr = (TextureBinding *)CONCAT44(fStack_1ac,local_1b0);
      local_228.m_state = pSVar27;
      if (pSVar27 == (SharedPtrStateBase *)0x0) goto LAB_00638525;
      LOCK();
      pSVar27->strongRefCount = pSVar27->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pSVar27->weakRefCount = pSVar27->weakRefCount + 1;
      UNLOCK();
      pSVar27 = (SharedPtrStateBase *)CONCAT44(local_1a8[1],local_1a8[0]);
    }
    if (pSVar27 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar27->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_1b0 = (undefined1  [4])0x0;
        fStack_1ac = 0.0;
        (**(code **)(*(long *)CONCAT44(local_1a8[1],local_1a8[0]) + 0x10))();
      }
      LOCK();
      piVar2 = (int *)(CONCAT44(local_1a8[1],local_1a8[0]) + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && ((long *)CONCAT44(local_1a8[1],local_1a8[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_1a8[1],local_1a8[0]) + 8))();
      }
    }
LAB_00638525:
    std::
    vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
    ::push_back(&(pTVar23->super_ShaderRenderCaseInstance).m_textures,&local_228);
    if (local_228.m_state == (SharedPtrStateBase *)0x0) {
      return (TestInstance *)pTVar23;
    }
    LOCK();
    pdVar1 = &(local_228.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_228.m_ptr = (TextureBinding *)0x0;
      (*(local_228.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_228.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 != 0) {
      return (TestInstance *)pTVar23;
    }
    if (local_228.m_state == (SharedPtrStateBase *)0x0) {
      return (TestInstance *)pTVar23;
    }
    (*(local_228.m_state)->_vptr_SharedPtrStateBase[1])();
    return (TestInstance *)pTVar23;
  default:
    return (TestInstance *)0x0;
  }
  *(undefined8 *)(pTVar23->super_ShaderRenderCaseInstance).m_renderSize.m_data = 0x100000001;
  return (TestInstance *)pTVar23;
}

Assistant:

TestInstance* TextureQueryCase::createInstance (Context& context) const
{
	switch (m_function)
	{
		case QUERYFUNCTION_TEXTURESIZE:				return new TextureSizeInstance(context, m_isVertexCase, m_textureSpec);
		case QUERYFUNCTION_TEXTUREQUERYLOD:			return new TextureQueryLodInstance(context, m_isVertexCase, m_textureSpec);
		case QUERYFUNCTION_TEXTUREQUERYLEVELS:		return new TextureQueryLevelsInstance(context, m_isVertexCase, m_textureSpec);
		case QUERYFUNCTION_TEXTURESAMPLES:			return new TextureSamplesInstance(context, m_isVertexCase, m_textureSpec);
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}